

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O1

void __thiscall CMU462::EdgeRecord::EdgeRecord(EdgeRecord *this,EdgeIter *_edge)

{
  double dVar1;
  double dVar2;
  _List_node_base *p_Var3;
  Vector3D *pVVar4;
  double *pdVar5;
  Vector3D *pVVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  _List_node_base *p_Var12;
  double dVar13;
  Vector3D b;
  Matrix3x3 A;
  Matrix4x4 K;
  double A_data [9];
  Vector3D local_1f0;
  double local_1d8;
  double dStack_1d0;
  Vector3D local_1c0;
  double local_1a8;
  double local_1a0;
  double local_198;
  Matrix3x3 local_190;
  Vector3D *local_148;
  Matrix3x3 local_140;
  Matrix4x4 local_f8;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  p_Var12 = _edge->_M_node;
  (this->edge)._M_node = p_Var12;
  pVVar6 = &this->optimalPoint;
  (this->optimalPoint).x = 0.0;
  (this->optimalPoint).y = 0.0;
  (this->optimalPoint).z = 0.0;
  this->score = 0.0;
  p_Var12 = p_Var12[5]._M_prev;
  Matrix4x4::operator+
            (&local_f8,(Matrix4x4 *)&p_Var12[2]._M_next[4]._M_prev,
             (Matrix4x4 *)&p_Var12[1]._M_next[2]._M_next[4]._M_prev);
  pdVar5 = Matrix4x4::operator()(&local_f8,0,0);
  local_78 = *pdVar5;
  pdVar5 = Matrix4x4::operator()(&local_f8,0,1);
  local_70 = *pdVar5;
  pdVar5 = Matrix4x4::operator()(&local_f8,0,2);
  local_68 = *pdVar5;
  pdVar5 = Matrix4x4::operator()(&local_f8,1,0);
  local_60 = *pdVar5;
  pdVar5 = Matrix4x4::operator()(&local_f8,1,1);
  local_58 = *pdVar5;
  pdVar5 = Matrix4x4::operator()(&local_f8,1,2);
  local_50 = *pdVar5;
  pdVar5 = Matrix4x4::operator()(&local_f8,2,0);
  local_48 = *pdVar5;
  pdVar5 = Matrix4x4::operator()(&local_f8,2,1);
  local_40 = *pdVar5;
  pdVar5 = Matrix4x4::operator()(&local_f8,2,2);
  local_38 = *pdVar5;
  Matrix3x3::Matrix3x3(&local_140,&local_78);
  pdVar5 = Matrix4x4::operator()(&local_f8,0,3);
  local_1d8 = *pdVar5;
  dStack_1d0 = 0.0;
  pdVar5 = Matrix4x4::operator()(&local_f8,1,3);
  dStack_1d0 = *pdVar5;
  pdVar5 = Matrix4x4::operator()(&local_f8,2,3);
  local_1c0.z = -*pdVar5;
  local_1c0.x = -local_1d8;
  local_1c0.y = -dStack_1d0;
  dVar11 = Matrix3x3::det(&local_140);
  if (dVar11 <= 0.01) {
    p_Var3 = p_Var12[2]._M_next;
    local_190.entries[0].x = (double)p_Var3[1]._M_next;
    local_190.entries[0].y = (double)p_Var3[1]._M_prev;
    local_190.entries[0].z = (double)p_Var3[2]._M_next;
    p_Var12 = p_Var12[1]._M_next[2]._M_next;
    local_1f0.x = (double)p_Var12[1]._M_next;
    local_1f0.y = (double)p_Var12[1]._M_prev;
    local_1f0.z = (double)p_Var12[2]._M_next;
    local_148 = pVVar6;
    if (0.0001 < (local_190.entries[0].z - local_1f0.z) * (local_190.entries[0].z - local_1f0.z) +
                 (local_190.entries[0].x - local_1f0.x) * (local_190.entries[0].x - local_1f0.x) +
                 (local_190.entries[0].y - local_1f0.y) * (local_190.entries[0].y - local_1f0.y)) {
      do {
        Matrix3x3::operator*(&local_140,local_190.entries);
        dVar11 = local_190.entries[0].z * local_1c0.z +
                 local_190.entries[0].x * local_1c0.x + local_190.entries[0].y * local_1c0.y;
        local_1d8 = (local_198 * local_190.entries[0].z +
                    local_1a8 * local_190.entries[0].x + local_1a0 * local_190.entries[0].y) -
                    (dVar11 + dVar11);
        Matrix3x3::operator*(&local_140,&local_1f0);
        dVar11 = local_1c0.z * local_1f0.z + local_1c0.x * local_1f0.x + local_1c0.y * local_1f0.y;
        p_Var12 = (_List_node_base *)((local_1f0.x + local_190.entries[0].x) * 0.5);
        if (local_1d8 <=
            (local_198 * local_1f0.z + local_1a8 * local_1f0.x + local_1a0 * local_1f0.y) -
            (dVar11 + dVar11)) {
          pVVar6 = &local_1f0;
          local_1f0.x = (double)p_Var12;
          pVVar4 = &local_1f0;
        }
        else {
          pVVar6 = local_190.entries;
          local_190.entries[0].x = (double)p_Var12;
          pVVar4 = local_190.entries;
        }
        dVar11 = local_1f0.z + local_190.entries[0].z;
        pVVar6->y = (local_1f0.y + local_190.entries[0].y) * 0.5;
        pVVar4->z = dVar11 * 0.5;
      } while (0.0001 < (local_190.entries[0].z - local_1f0.z) *
                        (local_190.entries[0].z - local_1f0.z) +
                        (local_190.entries[0].x - local_1f0.x) *
                        (local_190.entries[0].x - local_1f0.x) +
                        (local_190.entries[0].y - local_1f0.y) *
                        (local_190.entries[0].y - local_1f0.y));
    }
    local_148->z = local_190.entries[0].z;
    pVVar6 = local_148;
    uVar7 = local_190.entries[0].x._0_4_;
    uVar8 = local_190.entries[0].x._4_4_;
    uVar9 = local_190.entries[0].y._0_4_;
    uVar10 = local_190.entries[0].y._4_4_;
  }
  else {
    Matrix3x3::inv(&local_190,&local_140);
    Matrix3x3::operator*(&local_190,&local_1c0);
    (this->optimalPoint).z = local_1f0.z;
    uVar7 = local_1f0.x._0_4_;
    uVar8 = local_1f0.x._4_4_;
    uVar9 = local_1f0.y._0_4_;
    uVar10 = local_1f0.y._4_4_;
  }
  *(undefined4 *)&pVVar6->x = uVar7;
  *(undefined4 *)((long)&pVVar6->x + 4) = uVar8;
  *(undefined4 *)&pVVar6->y = uVar9;
  *(undefined4 *)((long)&pVVar6->y + 4) = uVar10;
  Matrix3x3::operator*(&local_140,pVVar6);
  dVar11 = (this->optimalPoint).x;
  dVar1 = (this->optimalPoint).y;
  dVar2 = (this->optimalPoint).z;
  dVar13 = dVar2 * local_1c0.z + dVar11 * local_1c0.x + dVar1 * local_1c0.y;
  local_1d8 = (local_190.entries[0].z * dVar2 +
              local_190.entries[0].x * dVar11 + local_190.entries[0].y * dVar1) - (dVar13 + dVar13);
  pdVar5 = Matrix4x4::operator()(&local_f8,3,3);
  this->score = local_1d8 + *pdVar5;
  return;
}

Assistant:

EdgeRecord::EdgeRecord(EdgeIter& _edge) : edge(_edge) {
  // Compute the combined quadric from the edge endpoints.

  auto h = edge->halfedge();
  auto K = h->vertex()->quadric + h->twin()->vertex()->quadric;

  // -> Build the 3x3 linear system whose solution minimizes the quadric error
  //    associated with these two endpoints.

  double A_data[9] = { K(0,0), K(0,1), K(0,2),
                       K(1,0), K(1,1), K(1,2),
                       K(2,0), K(2,1), K(2,2) };
  auto A = Matrix3x3(A_data);
  auto b = Vector3D(-K(0,3), -K(1,3), -K(2,3));

  // -> Use this system to solve for the optimal position, and store it in
  //    EdgeRecord::optimalPoint.

  if (A.det() > 0.01) {
    optimalPoint = A.inv() * b;
  } else {
//    cerr << "detA is too small: " << A.det() << endl;
//    cerr << "inverse answer: " << A.inv() * b << endl;

    auto p0 = h->vertex()->position, p1 = h->twin()->vertex()->position;
    while ((p0 - p1).norm2() > 0.0001) {
      auto c0 = dot(p0, A * p0) - 2 * dot(b, p0),
           c1 = dot(p1, A * p1) - 2 * dot(b, p1);
      if (c0 > c1) {
        p0 = (p0 + p1) / 2;
      } else {
        p1 = (p0 + p1) / 2;
      }
    }
    optimalPoint = p0;

//    cerr << "actual answer: " << optimalPoint << endl << endl;
  }

  // -> Also store the cost associated with collapsing this edg in
  //    EdgeRecord::Cost.

  score = dot(optimalPoint, A * optimalPoint) - 2 * dot(b, optimalPoint) + K(3,3);
}